

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::cleanBuffer(CaptureVertexSeparate *this)

{
  cleanBuffer((CaptureVertexSeparate *)
              ((long)&this->_vptr_CaptureVertexSeparate +
              (long)this->_vptr_CaptureVertexSeparate[-0xf]));
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexSeparate::cleanBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (DE_NULL != m_buffers)
	{
		gl.deleteBuffers(m_max_transform_feedback_separate_attribs, m_buffers);

		delete[] m_buffers;

		m_buffers = DE_NULL;
	}
}